

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O2

CharCount __thiscall
UnifiedRegex::MatchLiteralNode::EmitScan
          (MatchLiteralNode *this,Compiler *compiler,bool isHeadSyncronizingNode)

{
  CountDomain *backup;
  Char CVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  undefined4 *puVar5;
  SyncToLiteralEquivTrivialLastPatCharAndConsumeInst *this_00;
  SyncToLiteralEquivTrivialLastPatCharAndBackupInst *this_01;
  uint8 *puVar6;
  SyncToLinearLiteralAndConsumeInst *this_02;
  SyncToChar2LiteralAndBackupInst *this_03;
  SyncToLinearLiteralAndBackupInst *this_04;
  SyncToLiteralAndConsumeInst *this_05;
  SyncToLiteralAndBackupInst *this_06;
  CharCount patLen;
  undefined7 in_register_00000011;
  ArenaAllocator *allocator;
  Char *pat;
  undefined1 local_60 [8];
  TextbookBoyerMooreSetup<char16_t> setup;
  
  pat = (compiler->program->rep).insts.litbuf.ptr + this->offset;
  bVar4 = (this->super_Node).prevConsumes.upper != 0;
  bVar3 = (this->super_Node).prevConsumes.lower != 0;
  setup._0_8_ = pat;
  if ((int)CONCAT71(in_register_00000011,isHeadSyncronizingNode) != 0) {
    if (bVar4 || bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x3e1,"(prevConsumes.IsExact(0))","prevConsumes.IsExact(0)");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    setup.pat._0_4_ = this->length;
    if (this->isEquivClass == true) {
      CVar1 = pat[(CharCount)setup.pat * 4 - 4];
      if (((CVar1 == pat[(CharCount)setup.pat * 4 - 3]) &&
          (CVar1 == pat[(CharCount)setup.pat * 4 - 2])) &&
         (CVar1 == pat[(CharCount)setup.pat * 4 - 1])) {
        this_00 = (SyncToLiteralEquivTrivialLastPatCharAndConsumeInst *)
                  Compiler::Emit(compiler,0x449);
        SyncToLiteralEquivTrivialLastPatCharAndConsumeInst::
        SyncToLiteralEquivTrivialLastPatCharAndConsumeInst(this_00,this->offset,this->length);
      }
      else {
        this_00 = (SyncToLiteralEquivTrivialLastPatCharAndConsumeInst *)
                  Compiler::Emit(compiler,0x449);
        SyncToLiteralEquivAndConsumeInst::SyncToLiteralEquivAndConsumeInst
                  ((SyncToLiteralEquivAndConsumeInst *)this_00,this->offset,this->length);
      }
      TextbookBoyerMoore<char16_t>::Setup
                (&(this_00->
                  super_SyncToLiteralAndConsumeInstT<UnifiedRegex::EquivScannerMixinT<1U>_>).
                  super_EquivScannerMixinT<1U>.super_ScannerMixin.scanner,compiler->rtAllocator,pat,
                 this->length,4);
    }
    else if ((CharCount)setup.pat == 2) {
      puVar6 = Compiler::Emit(compiler,5);
      *puVar6 = '2';
      *(undefined4 *)(puVar6 + 1) = *(undefined4 *)pat;
    }
    else if ((CharCount)setup.pat == 1) {
      puVar6 = Compiler::Emit(compiler,3);
      CVar1 = *pat;
      *puVar6 = '.';
      *(Char *)(puVar6 + 1) = CVar1;
    }
    else {
      TextbookBoyerMooreSetup<char16_t>::Init((TextbookBoyerMooreSetup<char16_t> *)local_60);
      if (local_60._0_4_ == DefaultScheme) {
        this_05 = (SyncToLiteralAndConsumeInst *)Compiler::Emit(compiler,0x449);
        SyncToLiteralAndConsumeInst::SyncToLiteralAndConsumeInst(this_05,this->offset,this->length);
        TextbookBoyerMoore<char16_t>::Setup
                  (&(this_05->
                    super_SyncToLiteralAndConsumeInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
                    ).super_ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>.scanner,
                   compiler->rtAllocator,(TextbookBoyerMooreSetup<char16_t> *)local_60);
      }
      else if (local_60._0_4_ == LinearScheme) {
        this_02 = (SyncToLinearLiteralAndConsumeInst *)Compiler::Emit(compiler,0x39);
        SyncToLinearLiteralAndConsumeInst::SyncToLinearLiteralAndConsumeInst
                  (this_02,this->offset,this->length);
        TextbookBoyerMooreWithLinearMap<char16_t>::Setup
                  (&(this_02->
                    super_SyncToLiteralAndConsumeInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
                    ).super_ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>.
                    scanner,compiler->rtAllocator,(TextbookBoyerMooreSetup<char16_t> *)local_60);
      }
    }
    return this->length;
  }
  setup.pat._0_4_ = this->length;
  if (bVar4 || bVar3) {
    backup = &(this->super_Node).prevConsumes;
    if (this->isEquivClass == false) {
      if ((CharCount)setup.pat == 2) {
        this_03 = (SyncToChar2LiteralAndBackupInst *)Compiler::Emit(compiler,0xd);
        SyncToChar2LiteralAndBackupInst::SyncToChar2LiteralAndBackupInst(this_03,*pat,pat[1],backup)
        ;
        return 0;
      }
      if ((CharCount)setup.pat == 1) {
        puVar6 = Compiler::Emit(compiler,0xb);
        CVar1 = *pat;
        *puVar6 = '7';
        *(Char *)(puVar6 + 1) = CVar1;
        *(CountDomain *)(puVar6 + 3) = *backup;
        return 0;
      }
      TextbookBoyerMooreSetup<char16_t>::Init((TextbookBoyerMooreSetup<char16_t> *)local_60);
      if (local_60._0_4_ == DefaultScheme) {
        this_06 = (SyncToLiteralAndBackupInst *)Compiler::Emit(compiler,0x451);
        SyncToLiteralAndBackupInst::SyncToLiteralAndBackupInst
                  (this_06,this->offset,this->length,backup);
        goto LAB_00d1088b;
      }
      if (local_60._0_4_ != LinearScheme) {
        return 0;
      }
      this_04 = (SyncToLinearLiteralAndBackupInst *)Compiler::Emit(compiler,0x41);
      SyncToLinearLiteralAndBackupInst::SyncToLinearLiteralAndBackupInst
                (this_04,this->offset,this->length,backup);
      goto LAB_00d107ed;
    }
    CVar1 = pat[(CharCount)setup.pat * 4 - 4];
    if (((CVar1 == pat[(CharCount)setup.pat * 4 - 3]) &&
        (CVar1 == pat[(CharCount)setup.pat * 4 - 2])) &&
       (CVar1 == pat[(CharCount)setup.pat * 4 - 1])) {
      this_01 = (SyncToLiteralEquivTrivialLastPatCharAndBackupInst *)Compiler::Emit(compiler,0x451);
      SyncToLiteralEquivTrivialLastPatCharAndBackupInst::
      SyncToLiteralEquivTrivialLastPatCharAndBackupInst(this_01,this->offset,this->length,backup);
    }
    else {
      this_01 = (SyncToLiteralEquivTrivialLastPatCharAndBackupInst *)Compiler::Emit(compiler,0x451);
      SyncToLiteralEquivAndBackupInst::SyncToLiteralEquivAndBackupInst
                ((SyncToLiteralEquivAndBackupInst *)this_01,this->offset,this->length,backup);
    }
    allocator = compiler->rtAllocator;
    patLen = this->length;
  }
  else {
    if (this->isEquivClass == false) {
      if ((CharCount)setup.pat == 2) {
        puVar6 = Compiler::Emit(compiler,5);
        *puVar6 = ')';
        *(undefined4 *)(puVar6 + 1) = *(undefined4 *)pat;
        return 0;
      }
      if ((CharCount)setup.pat == 1) {
        puVar6 = Compiler::Emit(compiler,3);
        CVar1 = *pat;
        *puVar6 = '%';
        *(Char *)(puVar6 + 1) = CVar1;
        return 0;
      }
      TextbookBoyerMooreSetup<char16_t>::Init((TextbookBoyerMooreSetup<char16_t> *)local_60);
      if (local_60._0_4_ == DefaultScheme) {
        this_06 = (SyncToLiteralAndBackupInst *)Compiler::Emit(compiler,0x449);
        SyncToLiteralAndContinueInst::SyncToLiteralAndContinueInst
                  ((SyncToLiteralAndContinueInst *)this_06,this->offset,this->length);
LAB_00d1088b:
        TextbookBoyerMoore<char16_t>::Setup
                  (&(this_06->
                    super_SyncToLiteralAndBackupInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
                    ).super_ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>.scanner,
                   compiler->rtAllocator,(TextbookBoyerMooreSetup<char16_t> *)local_60);
        return 0;
      }
      if (local_60._0_4_ != LinearScheme) {
        return 0;
      }
      this_04 = (SyncToLinearLiteralAndBackupInst *)Compiler::Emit(compiler,0x39);
      SyncToLinearLiteralAndContinueInst::SyncToLinearLiteralAndContinueInst
                ((SyncToLinearLiteralAndContinueInst *)this_04,this->offset,this->length);
LAB_00d107ed:
      TextbookBoyerMooreWithLinearMap<char16_t>::Setup
                (&(this_04->
                  super_SyncToLiteralAndBackupInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
                  ).super_ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>.
                  scanner,compiler->rtAllocator,(TextbookBoyerMooreSetup<char16_t> *)local_60);
      return 0;
    }
    CVar1 = pat[(CharCount)setup.pat * 4 - 4];
    if (((CVar1 == pat[(CharCount)setup.pat * 4 - 3]) &&
        (CVar1 == pat[(CharCount)setup.pat * 4 - 2])) &&
       (CVar1 == pat[(CharCount)setup.pat * 4 - 1])) {
      this_01 = (SyncToLiteralEquivTrivialLastPatCharAndBackupInst *)Compiler::Emit(compiler,0x449);
      SyncToLiteralEquivTrivialLastPatCharAndContinueInst::
      SyncToLiteralEquivTrivialLastPatCharAndContinueInst
                ((SyncToLiteralEquivTrivialLastPatCharAndContinueInst *)this_01,this->offset,
                 this->length);
    }
    else {
      this_01 = (SyncToLiteralEquivTrivialLastPatCharAndBackupInst *)Compiler::Emit(compiler,0x449);
      SyncToLiteralEquivAndContinueInst::SyncToLiteralEquivAndContinueInst
                ((SyncToLiteralEquivAndContinueInst *)this_01,this->offset,this->length);
    }
    allocator = compiler->rtAllocator;
    patLen = this->length;
  }
  TextbookBoyerMoore<char16_t>::Setup
            (&(this_01->super_SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_>).
              super_EquivScannerMixinT<1U>.super_ScannerMixin.scanner,allocator,pat,patLen,4);
  return 0;
}

Assistant:

CharCount MatchLiteralNode::EmitScan(Compiler& compiler, bool isHeadSyncronizingNode)
    {
        //
        // Compilation scheme:
        //
        //   SyncTo(Literal|LiteralEquiv|LinearLiteral)And(Continue|Consume|Backup)
        //

        Char * litptr = compiler.program->rep.insts.litbuf + offset;

        if (isHeadSyncronizingNode)
        {
            // For a head literal there's no need to back up after finding the literal, so use a faster instruction
            Assert(prevConsumes.IsExact(0)); // there should not be any consumes before this node
            if (isEquivClass)
            {
                const uint lastPatCharIndex = length - 1;
                if (litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize] == litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize + 1]
                    && litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize] == litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize + 2]
                    && litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize] == litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize + 3])
                {
                    EMIT(compiler, SyncToLiteralEquivTrivialLastPatCharAndConsumeInst, offset, length)->scanner.Setup(compiler.rtAllocator, litptr, length, CaseInsensitive::EquivClassSize);
                }
                else
                {
                    EMIT(compiler, SyncToLiteralEquivAndConsumeInst, offset, length)->scanner.Setup(compiler.rtAllocator, litptr, length, CaseInsensitive::EquivClassSize);
                }
            }
            else if (length == 1)
                EMIT(compiler, SyncToCharAndConsumeInst, litptr[0]);
            else if (length == 2)
                EMIT(compiler, SyncToChar2LiteralAndConsumeInst, litptr[0], litptr[1]);
            else
            {
                TextbookBoyerMooreSetup<char16> setup(litptr, length);
                switch (setup.GetScheme())
                {
                case TextbookBoyerMooreSetup<char16>::LinearScheme:
                    EMIT(compiler, SyncToLinearLiteralAndConsumeInst, offset, length)->scanner.Setup(compiler.rtAllocator, setup);
                    break;
                case TextbookBoyerMooreSetup<char16>::DefaultScheme:
                    EMIT(compiler, SyncToLiteralAndConsumeInst, offset, length)->scanner.Setup(compiler.rtAllocator, setup);
                    break;
                };
            }
            return length;
        }
        else
        {
            // We're synchronizing on a non-head literal so we may need to back up. Or if we're syncing to the first literal
            // inside a group for instance, then we won't need to back up but we cannot consume the literal.
            if (prevConsumes.IsExact(0))
            {
                if (isEquivClass)
                {
                    const uint lastPatCharIndex = length - 1;
                    if (litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize] == litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize + 1]
                        && litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize] == litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize + 2]
                        && litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize] == litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize + 3])
                    {
                        EMIT(compiler, SyncToLiteralEquivTrivialLastPatCharAndContinueInst, offset, length)->scanner.Setup(compiler.rtAllocator, litptr, length, CaseInsensitive::EquivClassSize);
                    }
                    else
                    {
                        EMIT(compiler, SyncToLiteralEquivAndContinueInst, offset, length)->scanner.Setup(compiler.rtAllocator, litptr, length, CaseInsensitive::EquivClassSize);
                    }
                }
                else if (length == 1)
                    EMIT(compiler, SyncToCharAndContinueInst, litptr[0]);
                else if (length == 2)
                    EMIT(compiler, SyncToChar2LiteralAndContinueInst, litptr[0], litptr[1]);
                else
                {
                    TextbookBoyerMooreSetup<char16> setup(litptr, length);
                    switch (setup.GetScheme())
                    {
                    case TextbookBoyerMooreSetup<char16>::LinearScheme:
                        EMIT(compiler, SyncToLinearLiteralAndContinueInst, offset, length)->scanner.Setup(compiler.rtAllocator, setup);
                        break;
                    case TextbookBoyerMooreSetup<char16>::DefaultScheme:
                        EMIT(compiler, SyncToLiteralAndContinueInst, offset, length)->scanner.Setup(compiler.rtAllocator, setup);
                        break;
                    };
                }
            }
            else
            {
                if (isEquivClass)
                {
                    const uint lastPatCharIndex = length - 1;
                    if (litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize] == litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize + 1]
                        && litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize] == litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize + 2]
                        && litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize] == litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize + 3])
                    {
                        EMIT(compiler, SyncToLiteralEquivTrivialLastPatCharAndBackupInst, offset, length, prevConsumes)->scanner.Setup(compiler.rtAllocator, litptr, length, CaseInsensitive::EquivClassSize);
                    }
                    else
                    {
                        EMIT(compiler, SyncToLiteralEquivAndBackupInst, offset, length, prevConsumes)->scanner.Setup(compiler.rtAllocator, litptr, length, CaseInsensitive::EquivClassSize);
                    }
                }
                else if (length == 1)
                    EMIT(compiler, SyncToCharAndBackupInst, litptr[0], prevConsumes);
                else if (length == 2)
                    EMIT(compiler, SyncToChar2LiteralAndBackupInst, litptr[0], litptr[1], prevConsumes);
                else
                {
                    TextbookBoyerMooreSetup<char16> setup(litptr, length);
                    switch (setup.GetScheme())
                    {
                    case TextbookBoyerMooreSetup<char16>::LinearScheme:
                        EMIT(compiler, SyncToLinearLiteralAndBackupInst, offset, length, prevConsumes)->scanner.Setup(compiler.rtAllocator, setup);
                        break;
                    case TextbookBoyerMooreSetup<char16>::DefaultScheme:
                        EMIT(compiler, SyncToLiteralAndBackupInst, offset, length, prevConsumes)->scanner.Setup(compiler.rtAllocator, setup);
                        break;
                    };
                }
            }
            return 0;
        }
    }